

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

int __thiscall
QAccessibleCalendarWidget::indexOfChild(QAccessibleCalendarWidget *this,QAccessibleInterface *child)

{
  int iVar1;
  long lVar2;
  QAbstractItemView *pQVar3;
  long *in_RSI;
  long *in_RDI;
  
  if (((in_RSI != (long *)0x0) && (lVar2 = (**(code **)(*in_RSI + 0x18))(), lVar2 != 0)) &&
     (iVar1 = (**(code **)(*in_RDI + 0x50))(), 0 < iVar1)) {
    (**(code **)(*in_RSI + 0x18))();
    pQVar3 = qobject_cast<QAbstractItemView*>((QObject *)0x7e4fc2);
    if (pQVar3 != (QAbstractItemView *)0x0) {
      iVar1 = (**(code **)(*in_RDI + 0x50))();
      return iVar1 + -1;
    }
    return 0;
  }
  return -1;
}

Assistant:

int QAccessibleCalendarWidget::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || childCount() <= 0)
        return -1;
    if (qobject_cast<QAbstractItemView *>(child->object()))
        return childCount() - 1; // FIXME
    return 0;
}